

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_DfsNodes(Fraig_Man_t *pMan,Fraig_Node_t **ppNodes,int nNodes,int fEquiv)

{
  Fraig_NodeVec_t *vNodes_00;
  int local_2c;
  int i;
  Fraig_NodeVec_t *vNodes;
  int fEquiv_local;
  int nNodes_local;
  Fraig_Node_t **ppNodes_local;
  Fraig_Man_t *pMan_local;
  
  pMan->nTravIds = pMan->nTravIds + 1;
  vNodes_00 = Fraig_NodeVecAlloc(100);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)ppNodes[local_2c] & 0xfffffffffffffffe),vNodes_00,
                  fEquiv);
  }
  return vNodes_00;
}

Assistant:

Fraig_NodeVec_t * Fraig_DfsNodes( Fraig_Man_t * pMan, Fraig_Node_t ** ppNodes, int nNodes, int fEquiv )
{
    Fraig_NodeVec_t * vNodes;
    int i;
    pMan->nTravIds++;
    vNodes = Fraig_NodeVecAlloc( 100 );
    for ( i = 0; i < nNodes; i++ )
        Fraig_Dfs_rec( pMan, Fraig_Regular(ppNodes[i]), vNodes, fEquiv );
    return vNodes;
}